

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window)

{
  uint uVar1;
  uint uVar2;
  ImGuiPopupRef *pIVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ulong uVar6;
  ImGuiWindow **ppIVar7;
  ulong uVar8;
  ulong uVar9;
  ImGuiWindow **ppIVar10;
  bool bVar11;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar6 = (ulong)uVar1;
  if (uVar6 != 0) {
    uVar5 = 0;
    if (0 < (int)uVar1 && ref_window != (ImGuiWindow *)0x0) {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      ppIVar7 = &pIVar3->Window;
      uVar8 = 1;
      uVar5 = 0;
      do {
        pIVar4 = pIVar3[uVar5].Window;
        if (pIVar4 != (ImGuiWindow *)0x0) {
          uVar2 = pIVar4->Flags;
          if ((uVar2 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                          ,0x1336,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *)");
          }
          uVar9 = uVar8;
          ppIVar10 = ppIVar7;
          if ((uVar2 >> 0x18 & 1) == 0) {
            do {
              if (*ppIVar10 == (ImGuiWindow *)0x0) {
                bVar11 = false;
              }
              else {
                bVar11 = (*ppIVar10)->RootWindow == ref_window->RootWindow;
              }
              if (uVar6 <= uVar9) break;
              ppIVar10 = ppIVar10 + 6;
              uVar9 = uVar9 + 1;
            } while (!bVar11);
            if (!bVar11) goto LAB_0014f422;
          }
        }
        uVar5 = uVar5 + 1;
        ppIVar7 = ppIVar7 + 6;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar6);
      uVar5 = (ulong)uVar1;
    }
LAB_0014f422:
    if ((int)uVar5 < (int)uVar1) {
      ClosePopupToLevel((int)uVar5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int n = 0;
    if (ref_window)
    {
        for (n = 0; n < g.OpenPopupStack.Size; n++)
        {
            ImGuiPopupRef& popup = g.OpenPopupStack[n];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack if popups are not direct descendant of the reference window (which is often the NavWindow)
            bool has_focus = false;
            for (int m = n; m < g.OpenPopupStack.Size && !has_focus; m++)
                has_focus = (g.OpenPopupStack[m].Window && g.OpenPopupStack[m].Window->RootWindow == ref_window->RootWindow);
            if (!has_focus)
                break;
        }
    }
    if (n < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the block below
        ClosePopupToLevel(n);
}